

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_def_io.c
# Opt level: O0

int32 parse_base_line(char *line,int lineno,acmod_id_t *acmod_id,uint32 *tmat,uint32 *state,
                     uint32 *n_state,acmod_set_t *acmod_set)

{
  acmod_id_t aVar1;
  int iVar2;
  int32 iVar3;
  char *__s2;
  bool bVar4;
  char **local_58;
  char **attrib;
  char *pcStack_48;
  uint n;
  char *tok;
  uint32 *n_state_local;
  uint32 *state_local;
  uint32 *tmat_local;
  acmod_id_t *acmod_id_local;
  char *pcStack_18;
  int lineno_local;
  char *line_local;
  
  tok = (char *)n_state;
  n_state_local = state;
  state_local = tmat;
  tmat_local = acmod_id;
  acmod_id_local._4_4_ = lineno;
  pcStack_18 = line;
  pcStack_48 = strtok(line," \t");
  aVar1 = acmod_set_name2id(acmod_set,pcStack_48);
  if (aVar1 == 0xffffffff) {
    attrib._4_4_ = 0;
    while( true ) {
      bVar4 = false;
      if (attrib._4_4_ < 3) {
        __s2 = strtok((char *)0x0," \t");
        iVar2 = strcmp("-",__s2);
        bVar4 = iVar2 == 0;
      }
      if (!bVar4) break;
      attrib._4_4_ = attrib._4_4_ + 1;
    }
    if (attrib._4_4_ < 3) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
              ,0xae,
              "Expected l, r and posn to be \"-\" for ci phone %s at line %d, currently \'%s\'\n",
              pcStack_48,(ulong)acmod_id_local._4_4_,pcStack_18);
      line_local._4_4_ = -1;
    }
    else {
      iVar3 = parse_rem(&local_58,state_local,n_state_local,(uint32 *)tok,acmod_id_local._4_4_);
      if (iVar3 == 0) {
        aVar1 = acmod_set_add_ci(acmod_set,pcStack_48,local_58);
        *tmat_local = aVar1;
        line_local._4_4_ = 0;
      }
      else {
        line_local._4_4_ = -1;
      }
    }
  }
  else {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
            ,0xa7,"%s multiply defined at line %d\n",pcStack_48,(ulong)acmod_id_local._4_4_);
    line_local._4_4_ = -1;
  }
  return line_local._4_4_;
}

Assistant:

static int32
parse_base_line(char *line,
		int lineno,
		acmod_id_t *acmod_id,
		uint32 *tmat,
		uint32 *state,
		uint32 *n_state,
		acmod_set_t *acmod_set)
{
    char *tok;
    unsigned int n;
    const char **attrib;

    tok = strtok(line, " \t");

    if (acmod_set_name2id(acmod_set, tok) != NO_ACMOD) {
	E_ERROR("%s multiply defined at line %d\n", tok, lineno);
	return S3_ERROR;
    }

    for (n = 0; (n < 3) && (strcmp("-", strtok(NULL, " \t")) == 0); n++);

    if (n < 3) {
	E_ERROR("Expected l, r and posn to be \"-\" for ci phone %s at line %d, currently '%s'\n", tok, lineno, line);
	return S3_ERROR;
    }

    if (parse_rem(&attrib, tmat, state, n_state, lineno) != S3_SUCCESS) {
        return S3_ERROR;
    }

    *acmod_id = acmod_set_add_ci(acmod_set, tok, attrib);
    
    return S3_SUCCESS;
}